

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiWindowSettings * __thiscall
ImChunkStream<ImGuiWindowSettings>::alloc_chunk(ImChunkStream<ImGuiWindowSettings> *this,size_t sz)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  char *__dest;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  iVar2 = (this->Buf).Size;
  uVar4 = (int)sz + 7U & 0xfffffffc;
  iVar5 = iVar2 + uVar4;
  iVar6 = (this->Buf).Capacity;
  if (iVar6 < iVar5) {
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar6 <= iVar5) {
      iVar6 = iVar5;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar6,GImAllocatorUserData);
    pcVar3 = (this->Buf).Data;
    if (pcVar3 != (char *)0x0) {
      memcpy(__dest,pcVar3,(long)(this->Buf).Size);
      pcVar3 = (this->Buf).Data;
      if ((pcVar3 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
    }
    (this->Buf).Data = __dest;
    (this->Buf).Capacity = iVar6;
  }
  else {
    __dest = (this->Buf).Data;
  }
  (this->Buf).Size = iVar5;
  *(uint *)(__dest + iVar2) = uVar4;
  return (ImGuiWindowSettings *)((long)(__dest + iVar2) + 4);
}

Assistant:

T*      alloc_chunk(size_t sz)      { size_t HDR_SZ = 4; sz = ((HDR_SZ + sz) + 3u) & ~3u; int off = Buf.Size; Buf.resize(off + (int)sz); ((int*)(void*)(Buf.Data + off))[0] = (int)sz; return (T*)(void*)(Buf.Data + off + (int)HDR_SZ); }